

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

void fmt::v6::internal::format_error_code(buffer<char> *out,int error_code,string_view message)

{
  locale_ref loc;
  buffer_range<char> out_00;
  bool bVar1;
  int value;
  type tVar2;
  basic_string_view<char> *this;
  void *in_RCX;
  basic_string_view<char> *__n;
  int in_EDX;
  void *__buf;
  uint32_t in_ESI;
  writer w;
  uint32_or_64_or_128_t<int> abs_value;
  size_t error_code_size;
  char *in_stack_ffffffffffffff58;
  buffer<char> *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff74;
  undefined4 uVar3;
  int local_88;
  void *local_80;
  int local_78;
  void *local_70;
  locale_ref local_50 [2];
  basic_writer<fmt::v6::buffer_range<char>_> local_40;
  uint32_t local_2c;
  long local_28;
  uint32_t local_1c;
  basic_string_view<char> local_10;
  
  local_1c = in_ESI;
  local_10.size_ = (size_t)in_RCX;
  local_10.data_._0_4_ = in_EDX;
  buffer<char>::resize(in_stack_ffffffffffffff60,(size_t)in_stack_ffffffffffffff58);
  local_28 = 8;
  local_2c = local_1c;
  bVar1 = is_negative<int,_0>(local_1c);
  uVar3 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff74);
  if (bVar1) {
    local_2c = -local_2c;
    local_28 = local_28 + 1;
  }
  value = count_digits(local_2c);
  tVar2 = to_unsigned<int>(value);
  local_28 = local_28 + (ulong)tVar2;
  buffer_range<char>::buffer_range
            ((buffer_range<char> *)CONCAT44(uVar3,value),
             (buffer<char> *)CONCAT44(tVar2,in_stack_ffffffffffffff68));
  locale_ref::locale_ref(local_50);
  out_00.super_output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>.it_.
  container._4_4_ = uVar3;
  out_00.super_output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>.it_.
  container._0_4_ = value;
  loc.locale_._4_4_ = tVar2;
  loc.locale_._0_4_ = in_stack_ffffffffffffff68;
  basic_writer<fmt::v6::buffer_range<char>_>::basic_writer
            ((basic_writer<fmt::v6::buffer_range<char>_> *)in_stack_ffffffffffffff60,out_00,loc);
  this = (basic_string_view<char> *)basic_string_view<char>::size(&local_10);
  __n = (basic_string_view<char> *)(500 - local_28);
  if (this <= __n) {
    basic_writer<fmt::v6::buffer_range<char>_>::write
              (&local_40,(int)local_10.data_,(void *)local_10.size_,(size_t)__n);
    basic_string_view<char>::basic_string_view(this,in_stack_ffffffffffffff58);
    basic_writer<fmt::v6::buffer_range<char>_>::write(&local_40,local_78,local_70,(size_t)__n);
  }
  basic_string_view<char>::basic_string_view(this,in_stack_ffffffffffffff58);
  basic_writer<fmt::v6::buffer_range<char>_>::write(&local_40,local_88,local_80,(size_t)__n);
  basic_writer<fmt::v6::buffer_range<char>_>::write(&local_40,local_1c,__buf,(size_t)__n);
  return;
}

Assistant:

FMT_FUNC void format_error_code(internal::buffer<char>& out, int error_code,
                                string_view message) FMT_NOEXCEPT {
  // Report error code making sure that the output fits into
  // inline_buffer_size to avoid dynamic memory allocation and potential
  // bad_alloc.
  out.resize(0);
  static const char SEP[] = ": ";
  static const char ERROR_STR[] = "error ";
  // Subtract 2 to account for terminating null characters in SEP and ERROR_STR.
  std::size_t error_code_size = sizeof(SEP) + sizeof(ERROR_STR) - 2;
  auto abs_value = static_cast<uint32_or_64_or_128_t<int>>(error_code);
  if (internal::is_negative(error_code)) {
    abs_value = 0 - abs_value;
    ++error_code_size;
  }
  error_code_size += internal::to_unsigned(internal::count_digits(abs_value));
  internal::writer w(out);
  if (message.size() <= inline_buffer_size - error_code_size) {
    w.write(message);
    w.write(SEP);
  }
  w.write(ERROR_STR);
  w.write(error_code);
  assert(out.size() <= inline_buffer_size);
}